

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_qpak.c
# Opt level: O1

int qpakLoadEntries(PHYSFS_Io *io,PHYSFS_uint32 count,void *arc)

{
  int iVar1;
  void *pvVar2;
  PHYSFS_uint32 size;
  PHYSFS_uint32 pos;
  char name [56];
  PHYSFS_uint32 local_70;
  PHYSFS_uint32 local_6c;
  char local_68 [56];
  
  if (count != 0) {
    do {
      iVar1 = __PHYSFS_readAll(io,local_68,0x38);
      if (((iVar1 == 0) || (iVar1 = __PHYSFS_readAll(io,&local_6c,4), iVar1 == 0)) ||
         (iVar1 = __PHYSFS_readAll(io,&local_70,4), iVar1 == 0)) {
        return 0;
      }
      local_70 = PHYSFS_swapULE32(local_70);
      local_6c = PHYSFS_swapULE32(local_6c);
      pvVar2 = UNPK_addEntry(arc,local_68,0,-1,-1,(ulong)local_6c,(ulong)local_70);
      if (pvVar2 == (void *)0x0) {
        return 0;
      }
      count = count - 1;
    } while (count != 0);
  }
  return 1;
}

Assistant:

static int qpakLoadEntries(PHYSFS_Io *io, const PHYSFS_uint32 count, void *arc)
{
    PHYSFS_uint32 i;
    for (i = 0; i < count; i++)
    {
        PHYSFS_uint32 size;
        PHYSFS_uint32 pos;
        char name[56];
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, name, 56), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &pos, 4), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &size, 4), 0);
        size = PHYSFS_swapULE32(size);
        pos = PHYSFS_swapULE32(pos);
        BAIL_IF_ERRPASS(!UNPK_addEntry(arc, name, 0, -1, -1, pos, size), 0);
    } /* for */

    return 1;
}